

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O1

void __thiscall tf::Executor::Executor(Executor *this,size_t N,shared_ptr<tf::WorkerInterface> *wix)

{
  vector<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
  *this_00;
  pointer pWVar1;
  size_type sVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  value_type *pvVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  size_type __n;
  long lVar9;
  size_t sVar10;
  anon_class_16_2_d7082b3e_for__M_head_impl local_88;
  undefined1 local_78 [48];
  undefined1 local_48 [24];
  
  *(undefined8 *)((long)&(this->_taskflows_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_taskflows_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_taskflows_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_taskflows_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->_taskflows_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::vector<tf::Worker,_std::allocator<tf::Worker>_>::vector
            (&this->_workers,N,(allocator_type *)&local_88);
  (this->_notifier)._state.super___atomic_base<unsigned_long>._M_i = 0x3fff;
  this_00 = &(this->_notifier)._waiters;
  std::vector<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
  ::vector(this_00,N,(allocator_type *)&local_88);
  local_78._32_8_ = &this->_topology_cv;
  local_78._40_8_ = this_00;
  std::condition_variable::condition_variable((condition_variable *)local_78._32_8_);
  local_78._24_8_ = &this->_taskflows;
  (this->_topology_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->_num_topologies = 0;
  *(undefined8 *)((long)&(this->_topology_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_topology_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_topology_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_topology_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->_taskflows).super__List_base<tf::Taskflow,_std::allocator<tf::Taskflow>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)local_78._24_8_;
  (this->_taskflows).super__List_base<tf::Taskflow,_std::allocator<tf::Taskflow>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)local_78._24_8_;
  (this->_taskflows).super__List_base<tf::Taskflow,_std::allocator<tf::Taskflow>_>._M_impl._M_node.
  _M_size = 0;
  local_78._16_8_ = &this->_buffers;
  sVar2 = 0x3f;
  if (N != 0) {
    for (; N >> sVar2 == 0; sVar2 = sVar2 - 1) {
    }
  }
  __n = 1;
  if (3 < N) {
    __n = sVar2;
  }
  std::vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>::
  vector((vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
          *)local_78._16_8_,__n,(allocator_type *)&local_88);
  (this->_worker_interface).super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar3 = (wix->super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var4 = (wix->super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (wix->super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_worker_interface).super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar3;
  (this->_worker_interface).super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var4;
  (wix->super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (this->_observers)._M_h._M_buckets = &(this->_observers)._M_h._M_single_bucket;
  (this->_observers)._M_h._M_bucket_count = 1;
  (this->_observers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_observers)._M_h._M_element_count = 0;
  (this->_observers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_observers)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_observers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (N == 0) {
    throw_re<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/executor.hpp"
               ,0x479,(char (*) [41])"executor must define at least one worker");
  }
  else {
    lVar9 = 0;
    lVar8 = 0;
    sVar10 = 0;
    do {
      pWVar1 = (this->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_88.w = (value_type *)(&pWVar1->_done + lVar8);
      *(size_t *)((long)&pWVar1->_id + lVar8) = sVar10;
      *(size_t *)((long)&pWVar1->_vtm + lVar8) = sVar10;
      *(Executor **)((long)&pWVar1->_executor + lVar8) = this;
      *(long *)((long)&pWVar1->_waiter + lVar8) =
           (long)&(((this->_notifier)._waiters.
                    super__Vector_base<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
                    ._M_impl.super__Vector_impl_data._M_start)->next).
                  super___atomic_base<unsigned_long>._M_i + lVar9;
      local_88.this = this;
      std::thread::thread<tf::Executor::_spawn(unsigned_long)::_lambda()_1_,,void>
                ((thread *)(local_48 + 0x10),&local_88);
      pWVar1 = (this->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (*(long *)((long)&(pWVar1->_thread)._M_id._M_thread + lVar8) != 0) {
        std::terminate();
      }
      *(undefined8 *)((long)&(pWVar1->_thread)._M_id._M_thread + lVar8) = local_48._16_8_;
      sVar10 = sVar10 + 1;
      lVar8 = lVar8 + 0x980;
      lVar9 = lVar9 + 0x80;
    } while (N != sVar10);
  }
  local_88.w = (value_type *)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"TF_ENABLE_PROFILER","");
  pvVar5 = local_88.w;
  pcVar7 = getenv((char *)local_88.w);
  if (pvVar5 != (value_type *)local_78) {
    operator_delete(pvVar5,local_78._0_8_ + 1);
  }
  if (pcVar7 != (char *)0x0) {
    if ((TFProfManager::get()::mgr == '\0') &&
       (iVar6 = __cxa_guard_acquire(&TFProfManager::get()::mgr), iVar6 != 0)) {
      TFProfManager::TFProfManager((TFProfManager *)TFProfManager::get()::mgr);
      __cxa_atexit(TFProfManager::~TFProfManager,TFProfManager::get()::mgr,&__dso_handle);
      __cxa_guard_release(&TFProfManager::get()::mgr);
    }
    make_observer<tf::TFProfObserver>((Executor *)local_48);
    iVar6 = pthread_mutex_lock((pthread_mutex_t *)(TFProfManager::get()::mgr + 0x20));
    if (iVar6 != 0) {
      std::__throw_system_error(iVar6);
    }
    std::
    vector<std::shared_ptr<tf::TFProfObserver>,std::allocator<std::shared_ptr<tf::TFProfObserver>>>
    ::emplace_back<std::shared_ptr<tf::TFProfObserver>>
              ((vector<std::shared_ptr<tf::TFProfObserver>,std::allocator<std::shared_ptr<tf::TFProfObserver>>>
                *)(TFProfManager::get()::mgr + 0x48),(shared_ptr<tf::TFProfObserver> *)local_48);
    pthread_mutex_unlock((pthread_mutex_t *)(TFProfManager::get()::mgr + 0x20));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
  }
  return;
}

Assistant:

inline Executor::Executor(size_t N, std::shared_ptr<WorkerInterface> wix) :
  _workers  (N),
  _notifier (N),
  _buffers  (N),
  _worker_interface(std::move(wix)) {

  if(N == 0) {
    TF_THROW("executor must define at least one worker");
  }

  _spawn(N);

  // initialize the default observer if requested
  if(has_env(TF_ENABLE_PROFILER)) {
    TFProfManager::get()._manage(make_observer<TFProfObserver>());
  }
}